

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall HighsSparseMatrix::createRowwise(HighsSparseMatrix *this,HighsSparseMatrix *matrix)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer piVar9;
  pointer pdVar10;
  HighsInt HVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  vector<int,_std::allocator<int>_> ar_end;
  _Vector_base<int,_std::allocator<int>_> local_58;
  value_type_conflict2 local_34;
  
  uVar2 = matrix->num_col_;
  uVar3 = matrix->num_row_;
  HVar11 = numNz(matrix);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->start_,(long)(int)uVar3 + 1);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            ((vector<int,_std::allocator<int>_> *)&local_58,(long)(int)uVar3,&local_34);
  piVar6 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  uVar14 = 0;
  if (0 < (int)uVar2) {
    uVar14 = (ulong)uVar2;
  }
  while (uVar12 != uVar14) {
    piVar1 = piVar6 + uVar12;
    uVar12 = uVar12 + 1;
    piVar7 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar13 = (long)*piVar1; lVar13 < piVar6[uVar12]; lVar13 = lVar13 + 1) {
      local_58._M_impl.super__Vector_impl_data._M_start[piVar7[lVar13]] =
           local_58._M_impl.super__Vector_impl_data._M_start[piVar7[lVar13]] + 1;
    }
  }
  piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar6 = 0;
  uVar12 = 0;
  uVar15 = 0;
  if (0 < (int)uVar3) {
    uVar15 = (ulong)uVar3;
  }
  for (; uVar15 != uVar12; uVar12 = uVar12 + 1) {
    piVar6[uVar12 + 1] = local_58._M_impl.super__Vector_impl_data._M_start[uVar12] + piVar6[uVar12];
    local_58._M_impl.super__Vector_impl_data._M_start[uVar12] = piVar6[uVar12];
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->index_,(long)HVar11);
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)HVar11);
  piVar6 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  while (uVar15 = uVar12, uVar15 != uVar14) {
    piVar7 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar13 = (long)piVar6[uVar15]; uVar12 = uVar15 + 1, lVar13 < piVar6[uVar15 + 1];
        lVar13 = lVar13 + 1) {
      iVar4 = piVar7[lVar13];
      iVar5 = local_58._M_impl.super__Vector_impl_data._M_start[iVar4];
      local_58._M_impl.super__Vector_impl_data._M_start[iVar4] = iVar5 + 1;
      piVar9[iVar5] = (int)uVar15;
      pdVar10[iVar5] = pdVar8[lVar13];
    }
  }
  this->format_ = kRowwise;
  this->num_col_ = uVar2;
  this->num_row_ = uVar3;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void HighsSparseMatrix::createRowwise(const HighsSparseMatrix& matrix) {
  assert(matrix.formatOk());
  assert(matrix.isColwise());
  assert(this->formatOk());

  HighsInt num_col = matrix.num_col_;
  HighsInt num_row = matrix.num_row_;
  HighsInt num_nz = matrix.numNz();
  const vector<HighsInt>& a_start = matrix.start_;
  const vector<HighsInt>& a_index = matrix.index_;
  const vector<double>& a_value = matrix.value_;
  vector<HighsInt>& ar_start = this->start_;
  vector<HighsInt>& ar_index = this->index_;
  vector<double>& ar_value = this->value_;

  // Use ar_end to compute lengths, which are then transformed into
  // the ends of the inserted entries
  std::vector<HighsInt> ar_end;
  ar_start.resize(num_row + 1);
  ar_end.assign(num_row, 0);
  // Count the nonzeros in each row
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
      HighsInt iRow = a_index[iEl];
      ar_end[iRow]++;
    }
  }
  // Compute the starts and turn the lengths into ends
  ar_start[0] = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    ar_start[iRow + 1] = ar_start[iRow] + ar_end[iRow];
    ar_end[iRow] = ar_start[iRow];
  }
  ar_index.resize(num_nz);
  ar_value.resize(num_nz);
  // Insert the entries
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
      HighsInt iRow = a_index[iEl];
      HighsInt iToEl = ar_end[iRow]++;
      ar_index[iToEl] = iCol;
      ar_value[iToEl] = a_value[iEl];
    }
  }
  this->format_ = MatrixFormat::kRowwise;
  this->num_col_ = num_col;
  this->num_row_ = num_row;
}